

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>::int_writer<char,_fmt::v5::basic_format_specs<char>_>::dec_writer>
          *f)

{
  byte bVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  char __tmp;
  size_t __len_1;
  ulong uVar5;
  size_t __len;
  size_t __n;
  char *pcVar6;
  char *local_38;
  
  uVar2 = spec->width_;
  uVar5 = f->size_;
  __n = uVar2 - uVar5;
  if (uVar2 < uVar5 || __n == 0) {
    plVar3 = *(long **)this;
    lVar4 = plVar3[1];
    std::__cxx11::string::resize((ulong)plVar3,(char)uVar5 + (char)lVar4);
    local_38 = (char *)(lVar4 + *plVar3);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
                  *)f,&local_38);
  }
  else {
    plVar3 = *(long **)this;
    lVar4 = plVar3[1];
    std::__cxx11::string::resize((ulong)plVar3,(char)uVar2 + (char)lVar4);
    local_38 = (char *)(lVar4 + *plVar3);
    bVar1 = (byte)spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar5 = __n >> 1;
      pcVar6 = local_38;
      if (1 < __n) {
        pcVar6 = local_38 + uVar5;
        memset(local_38,(uint)bVar1,uVar5);
      }
      local_38 = pcVar6;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
                    *)f,&local_38);
      __n = __n - uVar5;
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        pcVar6 = local_38 + __n;
        memset(local_38,(uint)bVar1,__n);
        local_38 = pcVar6;
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
        ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
                      *)f,&local_38);
        return;
      }
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
                    *)f,&local_38);
    }
    memset(local_38,(uint)bVar1,__n);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }